

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableElimination.cpp
# Opt level: O1

ClauseIterator __thiscall
Inferences::ALASCA::VariableElimination::applyRule<Kernel::NumTraits<Kernel::RationalConstantType>>
          (VariableElimination *this,Clause *premise,
          FoundVariable<Kernel::NumTraits<Kernel::RationalConstantType>_> *found)

{
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *pFVar1;
  VariableElimination *this_00;
  uint uVar2;
  TermList TVar3;
  Term *pTVar4;
  Literal *pLVar5;
  TermList arg2;
  TermList sort;
  uint *in_RCX;
  long lVar6;
  long lVar7;
  FoundVariable<Kernel::NumTraits<Kernel::RationalConstantType>_> *pFVar8;
  PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *i_00;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *pFVar9;
  uint uVar10;
  code *pcVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *l;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *pFVar15;
  ulong uVar16;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *i;
  anon_class_8_1_54a39809_for__func aVar17;
  undefined8 *puVar18;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *j;
  ulong uVar19;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *pFVar20;
  bool bVar21;
  anon_class_16_1_54a39818_for_b b;
  Stack<Kernel::Literal_*> local_3a0;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_380;
  undefined1 local_378 [20];
  uint local_364;
  FoundVariable<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_360;
  undefined1 local_358 [8];
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *pFStack_350;
  anon_class_8_1_54a39809_for__func local_348;
  anon_class_8_1_54a39809_for__func aStack_340;
  anon_class_8_1_54a39818_for__func local_338;
  Value local_330;
  anon_class_8_1_54a39809_for__func local_300;
  anon_class_8_1_54a39809_for__func local_2f8;
  anon_class_8_1_54a39809_for__func local_2f0;
  anon_class_8_1_54a39801_for__func local_2e8;
  anon_class_8_1_54a39801_for__func local_2e0;
  unsigned_long uStack_2d8;
  unsigned_long local_2d0;
  OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*> local_2c8;
  OptionBaseRef<const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*> local_2c0;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *local_2b0;
  VariableElimination *local_2a8;
  ulong local_2a0;
  undefined8 local_298;
  ulong local_290;
  ulong local_288;
  ulong local_280;
  long local_278;
  undefined8 *puStack_270;
  undefined8 *local_268;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *pSStack_260;
  PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  local_250;
  IterTraits<Lib::MappingIterator<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:313:12),_Kernel::Clause_*>_>
  local_1f8;
  anon_class_184_10_db932ed9_for__func local_e8;
  
  local_2a0 = *(long *)(in_RCX + 0x18) - *(long *)(in_RCX + 0x16) >> 6;
  local_364 = *in_RCX;
  local_2b0 = *(Monom<Kernel::NumTraits<Kernel::RealConstantType>_> **)(in_RCX + 2);
  if (*(long *)(in_RCX + 0x18) != *(long *)(in_RCX + 0x16)) {
    *(int *)(DAT_00b7e1c0 + 0x194) = *(int *)(DAT_00b7e1c0 + 0x194) + 1;
  }
  lVar6 = DAT_00b7e1c0;
  *(int *)(DAT_00b7e1c0 + 0x198) = *(int *)(DAT_00b7e1c0 + 0x198) + (int)local_2a0;
  if (*(uint *)(lVar6 + 0x19c) < local_2a0) {
    *(int *)(lVar6 + 0x19c) = (int)local_2a0;
  }
  lVar6 = *(long *)(in_RCX + 8) - *(long *)(in_RCX + 6) >> 6;
  lVar7 = *(long *)(in_RCX + 0x10) - *(long *)(in_RCX + 0xe) >> 6;
  lVar12 = *(long *)(in_RCX + 0x20) - *(long *)(in_RCX + 0x1e) >> 6;
  local_3a0._capacity =
       ((lVar7 * lVar6 + (ulong)((uint)(found->negIneq)._stack & 0xfffff)) -
       (lVar12 + lVar7 + lVar6 + local_2a0)) + (lVar7 + lVar6) * lVar12;
  local_360 = found;
  if (local_3a0._capacity == 0) {
    local_3a0._stack = (Literal **)0x0;
  }
  else {
    uVar13 = local_3a0._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar13 == 0) {
      local_3a0._stack =
           (Literal **)
           ::Lib::FixedSizeAllocator<8UL>::alloc
                     ((FixedSizeAllocator<8UL> *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar13 < 0x11) {
      local_3a0._stack =
           (Literal **)
           ::Lib::FixedSizeAllocator<16UL>::alloc
                     ((FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    }
    else if (uVar13 < 0x19) {
      local_3a0._stack =
           (Literal **)
           ::Lib::FixedSizeAllocator<24UL>::alloc
                     ((FixedSizeAllocator<24UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
    }
    else if (uVar13 < 0x21) {
      local_3a0._stack =
           (Literal **)
           ::Lib::FixedSizeAllocator<32UL>::alloc
                     ((FixedSizeAllocator<32UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    }
    else if (uVar13 < 0x31) {
      local_3a0._stack =
           (Literal **)
           ::Lib::FixedSizeAllocator<48UL>::alloc
                     ((FixedSizeAllocator<48UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    }
    else if (uVar13 < 0x41) {
      local_3a0._stack =
           (Literal **)
           ::Lib::FixedSizeAllocator<64UL>::alloc
                     ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    }
    else {
      local_3a0._stack = (Literal **)::operator_new(uVar13,0x10);
    }
  }
  local_3a0._end = local_3a0._stack + local_3a0._capacity;
  local_378._0_8_ = local_358;
  local_348.i = (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  aStack_340.i = (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_358 = (undefined1  [8])0x0;
  pFStack_350 = (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
  local_3a0._cursor = local_3a0._stack;
  const::{lambda(auto:1&)#1}::operator()
            ((_lambda_auto_1___1_ *)local_378,
             (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)(in_RCX + 0x14));
  const::{lambda(auto:1&)#1}::operator()
            ((_lambda_auto_1___1_ *)local_378,
             (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)(in_RCX + 0x1c));
  const::{lambda(auto:1&)#1}::operator()
            ((_lambda_auto_1___1_ *)local_378,
             (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)(in_RCX + 4));
  const::{lambda(auto:1&)#1}::operator()
            ((_lambda_auto_1___1_ *)local_378,
             (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)(in_RCX + 0xc));
  aVar17.i = local_348.i;
  pFVar9 = pFStack_350;
  if (pFStack_350 != local_348.i) {
    uVar13 = (long)local_348.i - (long)pFStack_350 >> 2;
    lVar6 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pFStack_350,local_348.i,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>(pFVar9,aVar17.i);
  }
  aVar17.i = local_348.i;
  if (pFStack_350 == local_348.i) {
    uVar10 = *(uint *)&(local_360->negIneq)._stack & 0xfffff;
    pFVar9 = pFStack_350;
  }
  else {
    uVar10 = pFStack_350->idx;
    pFVar9 = (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             &pFStack_350->field_0x4;
  }
  uVar2 = *(uint *)&(local_360->negIneq)._stack & 0xfffff;
  uVar13 = (ulong)uVar2;
  local_2a8 = this;
  if (uVar2 != 0) {
    uVar19 = 0;
    pFVar8 = local_360;
    do {
      if (uVar19 == uVar10) {
        if (pFVar9 == aVar17.i) {
          uVar10 = (uint)uVar13;
        }
        else {
          uVar10 = pFVar9->idx;
          pFVar9 = (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                   &pFVar9->field_0x4;
        }
      }
      else {
        pLVar5 = (Literal *)(&(pFVar8->neq)._capacity)[uVar19];
        if (local_3a0._cursor == local_3a0._end) {
          ::Lib::Stack<Kernel::Literal_*>::expand(&local_3a0);
        }
        *local_3a0._cursor = pLVar5;
        local_3a0._cursor = local_3a0._cursor + 1;
        pFVar8 = local_360;
      }
      uVar19 = uVar19 + 1;
      uVar13 = (ulong)((uint)(pFVar8->negIneq)._stack & 0xfffff);
    } while (uVar19 < uVar13);
  }
  if (pFStack_350 != (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0) {
    uVar13 = (long)local_358 * 4 + 0xfU & 0xfffffffffffffff0;
    if (uVar13 == 0) {
      *(undefined8 *)pFStack_350 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pFStack_350;
    }
    else if (uVar13 < 0x11) {
      *(undefined8 *)pFStack_350 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pFStack_350;
    }
    else if (uVar13 < 0x19) {
      *(undefined8 *)pFStack_350 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pFStack_350;
    }
    else if (uVar13 < 0x21) {
      *(undefined8 *)pFStack_350 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pFStack_350;
    }
    else if (uVar13 < 0x31) {
      *(undefined8 *)pFStack_350 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pFStack_350;
    }
    else if (uVar13 < 0x41) {
      *(undefined8 *)pFStack_350 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pFStack_350;
    }
    else {
      operator_delete(pFStack_350,0x10);
    }
  }
  local_378._0_4_ = local_364;
  local_378._8_8_ = local_2b0;
  pFVar9 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(in_RCX + 6);
  local_380 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(in_RCX + 8);
  if (pFVar9 != local_380) {
    do {
      pFVar1 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
                (in_RCX + 0x10);
      pFVar20 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
                 (in_RCX + 0xe);
      pFVar15 = pFVar20;
      for (; pFVar20 != pFVar1; pFVar20 = pFVar20 + 1) {
        if (((pFVar9->literal)._symbol != GREATER) ||
           (pcVar11 = Kernel::NumTraits<Kernel::RationalConstantType>::greater,
           (pFVar20->literal)._symbol != GREATER)) {
          pcVar11 = Kernel::NumTraits<Kernel::RationalConstantType>::geq;
        }
        local_330.init.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)(pFVar9->literal)._term._ptr;
        local_330._24_8_ =
             ((long)((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                    local_330.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->_cursor -
              (long)((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                    local_330.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->_stack >> 4) *
             -0x5555555555555555;
        local_2e8.a = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                      (pFVar20->literal)._term._ptr;
        local_2d0 = ((long)(local_2e8.a)->_cursor - (long)(local_2e8.a)->_stack >> 4) *
                    -0x5555555555555555;
        local_2e0.a = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)0x0;
        uStack_2d8 = 0;
        local_338.x = (Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
                       *)local_378;
        local_330._8_8_ = 0;
        local_330.init.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_358._1_7_ = (undefined7)((ulong)local_358 >> 8);
        local_358[0] = 1;
        local_330.init.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
        local_2c8._elem = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
        local_348.i = pFVar9;
        aStack_340.i = pFVar9;
        local_300.i = pFVar15;
        local_2f8.i = pFVar15;
        local_2f0.i = (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                      local_338.x;
        TVar3 = Kernel::NumTraits<Kernel::RationalConstantType>::sum<_f61951ce_>
                          ((IterTraits<_fd1694d2_> *)local_358);
        pTVar4 = Kernel::NumTraits<Kernel::RationalConstantType>::zeroT();
        pLVar5 = (Literal *)(*pcVar11)(1,TVar3._content,pTVar4);
        if (local_3a0._cursor == local_3a0._end) {
          ::Lib::Stack<Kernel::Literal_*>::expand(&local_3a0);
        }
        *local_3a0._cursor = pLVar5;
        local_3a0._cursor = local_3a0._cursor + 1;
        pFVar15 = pFVar15 + 1;
      }
      pFVar9 = pFVar9 + 1;
    } while (pFVar9 != local_380);
  }
  pFVar9 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(in_RCX + 6);
  local_380 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(in_RCX + 8);
  if (pFVar9 != local_380) {
    do {
      pFVar1 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
                (in_RCX + 0x20);
      pFVar20 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
                 (in_RCX + 0x1e);
      pFVar15 = pFVar20;
      for (; pFVar20 != pFVar1; pFVar20 = pFVar20 + 1) {
        pcVar11 = Kernel::NumTraits<Kernel::RationalConstantType>::geq;
        if ((pFVar9->literal)._symbol == GREATER) {
          pcVar11 = Kernel::NumTraits<Kernel::RationalConstantType>::greater;
        }
        local_330.init.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)(pFVar9->literal)._term._ptr;
        local_330._24_8_ =
             ((long)((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                    local_330.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->_cursor -
              (long)((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                    local_330.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->_stack >> 4) *
             -0x5555555555555555;
        local_2e0.a = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                      (pFVar20->literal)._term._ptr;
        local_2c8._elem =
             (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             (((long)(local_2e0.a)->_cursor - (long)(local_2e0.a)->_stack >> 4) *
             -0x5555555555555555);
        uStack_2d8 = 0;
        local_2d0 = 0;
        local_338.x = (Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
                       *)local_378;
        local_330._8_8_ = 0;
        local_330.init.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_358._1_7_ = (undefined7)((ulong)local_358 >> 8);
        local_358[0] = 1;
        local_330.init.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
        local_2c0._elem = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
        local_348.i = pFVar9;
        aStack_340.i = pFVar9;
        local_2f8.i = pFVar15;
        local_2f0.i = pFVar15;
        local_2e8.a = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                      local_338.x;
        TVar3 = Kernel::NumTraits<Kernel::RationalConstantType>::sum<_46f0486c_>
                          ((IterTraits<_cb7e2770_> *)local_358);
        pTVar4 = Kernel::NumTraits<Kernel::RationalConstantType>::zeroT();
        pLVar5 = (Literal *)(*pcVar11)(1,TVar3._content,pTVar4);
        if (local_3a0._cursor == local_3a0._end) {
          ::Lib::Stack<Kernel::Literal_*>::expand(&local_3a0);
        }
        *local_3a0._cursor = pLVar5;
        local_3a0._cursor = local_3a0._cursor + 1;
        pFVar15 = pFVar15 + 1;
      }
      pFVar9 = pFVar9 + 1;
    } while (pFVar9 != local_380);
  }
  pFVar9 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(in_RCX + 0xe);
  local_380 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
               (in_RCX + 0x10);
  if (pFVar9 != local_380) {
    do {
      pFVar1 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
                (in_RCX + 0x20);
      pFVar20 = *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)
                 (in_RCX + 0x1e);
      pFVar15 = pFVar20;
      for (; pFVar20 != pFVar1; pFVar20 = pFVar20 + 1) {
        pcVar11 = Kernel::NumTraits<Kernel::RationalConstantType>::geq;
        if ((pFVar9->literal)._symbol == GREATER) {
          pcVar11 = Kernel::NumTraits<Kernel::RationalConstantType>::greater;
        }
        local_330.init.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)(pFVar9->literal)._term._ptr;
        local_330._24_8_ =
             ((long)((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                    local_330.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->_cursor -
              (long)((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                    local_330.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->_stack >> 4) *
             -0x5555555555555555;
        local_2e8.a = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                      (pFVar20->literal)._term._ptr;
        local_2d0 = ((long)(local_2e8.a)->_cursor - (long)(local_2e8.a)->_stack >> 4) *
                    -0x5555555555555555;
        local_2e0.a = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)0x0;
        uStack_2d8 = 0;
        local_338.x = (Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
                       *)local_378;
        local_330._8_8_ = 0;
        local_330.init.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_358._1_7_ = (undefined7)((ulong)local_358 >> 8);
        local_358[0] = 1;
        local_330.init.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
        local_2c8._elem = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
        local_348.i = pFVar9;
        aStack_340.i = pFVar9;
        local_300.i = pFVar15;
        local_2f8.i = pFVar15;
        local_2f0.i = (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                      local_338.x;
        TVar3 = Kernel::NumTraits<Kernel::RationalConstantType>::sum<_f61951ce_>
                          ((IterTraits<_fd1694d2_> *)local_358);
        pTVar4 = Kernel::NumTraits<Kernel::RationalConstantType>::zeroT();
        pLVar5 = (Literal *)(*pcVar11)(1,TVar3._content,pTVar4);
        if (local_3a0._cursor == local_3a0._end) {
          ::Lib::Stack<Kernel::Literal_*>::expand(&local_3a0);
        }
        *local_3a0._cursor = pLVar5;
        local_3a0._cursor = local_3a0._cursor + 1;
        pFVar15 = pFVar15 + 1;
      }
      pFVar9 = pFVar9 + 1;
    } while (pFVar9 != local_380);
  }
  local_290 = (ulong)(*(long *)(in_RCX + 0x20) - *(long *)(in_RCX + 0x1e)) >> 6;
  bVar21 = (int)local_290 != 0;
  if (bVar21) {
    uVar19 = (ulong)bVar21;
    local_298 = 0x100000001;
    uVar13 = uVar19;
    do {
      lVar6 = (uVar13 >> 0x20) + 1;
      local_380 = (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                  ((ulong)(*(long *)(in_RCX + 0x20) - *(long *)(in_RCX + 0x1e)) >> 6);
      uVar2 = (int)lVar6 * (int)local_298;
      uVar16 = (lVar6 << 0x20) + 1;
      uVar10 = (uint)local_380;
      if (uVar10 <= uVar2) {
        uVar16 = 0;
      }
      local_288 = uVar19;
      local_280 = uVar13;
      if ((char)uVar16 == '\x01') {
        uVar14 = (uint)(uVar2 < uVar10) + (int)(uVar13 >> 0x20);
        uVar19 = (ulong)(uVar2 + (uVar2 < uVar10)) << 0x20;
        lVar6 = (uVar13 >> 0x20) * 0x40;
        do {
          lVar7 = *(long *)(in_RCX + 0x1e);
          local_348.i = (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                        (lVar7 + lVar6);
          local_330.init.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
          ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)*(long *)(lVar7 + 0x30 + lVar6);
          local_2f8.i = (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                        (lVar7 + (uVar16 >> 0x1a));
          local_330._24_8_ =
               ((long)((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                      local_330.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->_cursor -
                (long)((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                      local_330.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)->_stack >> 4)
               * -0x5555555555555555;
          local_2e0.a = *(Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> **)
                         (lVar7 + 0x30 + (uVar16 >> 0x1a));
          local_2c8._elem =
               (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
               (((long)(local_2e0.a)->_cursor - (long)(local_2e0.a)->_stack >> 4) *
               -0x5555555555555555);
          uStack_2d8 = 0;
          local_2d0 = 0;
          local_338.x = (Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
                         *)local_378;
          local_330._8_8_ = 0;
          local_330.init.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
          ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_358[0] = 1;
          local_330.init.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
          ._M_end_of_storage = (_Bit_pointer)0x0;
          local_2c0._elem = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0;
          aStack_340.i = local_348.i;
          local_2f0.i = local_2f8.i;
          local_2e8.a = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                        local_338.x;
          TVar3 = Kernel::NumTraits<Kernel::RationalConstantType>::sum<_46f0486c_>
                            ((IterTraits<_cb7e2770_> *)local_358);
          arg2._content = (uint64_t)Kernel::NumTraits<Kernel::RationalConstantType>::zeroT();
          sort = Kernel::AtomicSort::rationalSort();
          pLVar5 = Kernel::Literal::createEquality(false,TVar3,arg2,sort);
          if (local_3a0._cursor == local_3a0._end) {
            ::Lib::Stack<Kernel::Literal_*>::expand(&local_3a0);
          }
          *local_3a0._cursor = pLVar5;
          local_3a0._cursor = local_3a0._cursor + 1;
          uVar14 = uVar14 + 1;
          if (uVar14 < (uint)local_380) {
            uVar16 = uVar19;
          }
          uVar19 = uVar19 + 0x100000000;
        } while (uVar14 < (uint)local_380);
      }
      uVar19 = local_288 + ((uint)local_288 < (uint)local_290);
      uVar13 = local_288 << 0x20;
    } while ((uint)local_288 < (uint)local_290);
  }
  local_278 = *(long *)(in_RCX + 0x14);
  in_RCX[0x14] = 0;
  in_RCX[0x15] = 0;
  pSStack_260 = *(Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                  **)(in_RCX + 0x1a);
  in_RCX[0x1a] = 0;
  in_RCX[0x1b] = 0;
  puStack_270 = *(undefined8 **)(in_RCX + 0x16);
  local_268 = *(undefined8 **)(in_RCX + 0x18);
  in_RCX[0x18] = 0;
  in_RCX[0x19] = 0;
  in_RCX[0x16] = 0;
  in_RCX[0x17] = 0;
  partitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>>>
            (&local_250,(ALASCA *)&local_278,pSStack_260);
  ::Lib::
  iterTraits<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>>>>
            ((IterTraits<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>_>
              *)local_358,(Lib *)&local_250,i_00);
  this_00 = local_2a8;
  local_e8.common._cursor = local_3a0._cursor;
  local_e8.common._capacity = local_3a0._capacity;
  local_3a0._capacity = 0;
  local_e8.common._end = local_3a0._end;
  local_3a0._end = (Literal **)0x0;
  local_3a0._cursor = (Literal **)0x0;
  local_e8.common._stack = local_3a0._stack;
  local_3a0._stack = (Literal **)0x0;
  local_e8.I._capacity = *(size_t *)(in_RCX + 4);
  in_RCX[4] = 0;
  in_RCX[5] = 0;
  local_e8.I._end =
       *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(in_RCX + 10);
  in_RCX[10] = 0;
  in_RCX[0xb] = 0;
  local_e8.I._stack =
       *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(in_RCX + 6);
  local_e8.I._cursor =
       *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(in_RCX + 8);
  in_RCX[8] = 0;
  in_RCX[9] = 0;
  in_RCX[6] = 0;
  in_RCX[7] = 0;
  local_e8.J._capacity = *(size_t *)(in_RCX + 0xc);
  in_RCX[0xc] = 0;
  in_RCX[0xd] = 0;
  local_e8.J._end =
       *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(in_RCX + 0x12);
  in_RCX[0x12] = 0;
  in_RCX[0x13] = 0;
  local_e8.J._stack =
       *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(in_RCX + 0xe);
  local_e8.J._cursor =
       *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(in_RCX + 0x10);
  in_RCX[0x10] = 0;
  in_RCX[0x11] = 0;
  in_RCX[0xe] = 0;
  in_RCX[0xf] = 0;
  local_e8.L._capacity = *(size_t *)(in_RCX + 0x1c);
  in_RCX[0x1c] = 0;
  in_RCX[0x1d] = 0;
  local_e8.L._end =
       *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(in_RCX + 0x22);
  in_RCX[0x22] = 0;
  in_RCX[0x23] = 0;
  local_e8.L._stack =
       *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(in_RCX + 0x1e);
  local_e8.L._cursor =
       *(FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> **)(in_RCX + 0x20);
  in_RCX[0x20] = 0;
  in_RCX[0x21] = 0;
  in_RCX[0x1e] = 0;
  in_RCX[0x1f] = 0;
  local_e8.withoutX.x._id = local_364;
  local_e8.withoutX.x._ptr =
       (MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)local_2b0;
  local_e8.premise = (Clause *)local_360;
  local_e8.Ksize = local_2a0;
  local_e8.b.x._id = local_378._0_4_;
  local_e8.b.x._ptr =
       (MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)local_378._8_8_;
  ::Lib::
  IterTraits<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>>>>
  ::
  map<Inferences::ALASCA::VariableElimination::applyRule<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::Clause*,Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::RationalConstantType>>)const::_lambda(auto:1&)_3_>
            (&local_1f8,local_358,&local_e8);
  ::Lib::
  pvi<Lib::IterTraits<Lib::MappingIterator<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>>>,Inferences::ALASCA::VariableElimination::applyRule<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::Clause*,Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::RationalConstantType>>)const::_lambda(auto:1&)_3_,Kernel::Clause*>>>
            ((Lib *)this_00,&local_1f8);
  ::Lib::OptionBase<std::vector<bool,_std::allocator<bool>_>_>::~OptionBase
            (&local_1f8._iter._inner._partition.
              super_OptionBase<std::vector<bool,_std::allocator<bool>_>_>);
  for (; local_1f8._iter._inner._orig._cursor != local_1f8._iter._inner._orig._stack;
      local_1f8._iter._inner._orig._cursor = local_1f8._iter._inner._orig._cursor + -1) {
    mpz_clear(local_1f8._iter._inner._orig._cursor[-1].numeral._den._val);
    mpz_clear((__mpz_struct *)&local_1f8._iter._inner._orig._cursor[-1].numeral);
  }
  if (local_1f8._iter._inner._orig._stack !=
      (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0) {
    if (local_1f8._iter._inner._orig._capacity << 6 == 0) {
      *(undefined8 *)local_1f8._iter._inner._orig._stack =
           ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_1f8._iter._inner._orig._stack;
    }
    else if (local_1f8._iter._inner._orig._capacity << 6 < 0x41) {
      *(undefined8 *)local_1f8._iter._inner._orig._stack =
           ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_1f8._iter._inner._orig._stack;
    }
    else {
      operator_delete(local_1f8._iter._inner._orig._stack,0x10);
    }
  }
  const::{lambda(auto:1&)#3}::~FoundVariable((_lambda_auto_1___3_ *)&local_1f8);
  const::{lambda(auto:1&)#3}::~FoundVariable((_lambda_auto_1___3_ *)&local_e8);
  ::Lib::OptionBase<std::vector<bool,_std::allocator<bool>_>_>::~OptionBase
            ((OptionBase<std::vector<bool,_std::allocator<bool>_>_> *)&local_338);
  for (aVar17.i = local_348.i; aVar17.i != pFStack_350; aVar17.i = aVar17.i + -1) {
    mpz_clear(aVar17.i[-1].numeral._den._val);
    mpz_clear((__mpz_struct *)&aVar17.i[-1].numeral);
  }
  if (pFStack_350 != (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0) {
    if ((long)local_358 << 6 == 0) {
      *(undefined8 *)pFStack_350 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pFStack_350;
    }
    else if ((ulong)((long)local_358 << 6) < 0x41) {
      *(undefined8 *)pFStack_350 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pFStack_350;
    }
    else {
      operator_delete(pFStack_350,0x10);
    }
  }
  ::Lib::OptionBase<std::vector<bool,_std::allocator<bool>_>_>::~OptionBase
            (&local_250._partition.super_OptionBase<std::vector<bool,_std::allocator<bool>_>_>);
  for (; local_250._orig._cursor != local_250._orig._stack;
      local_250._orig._cursor = local_250._orig._cursor + -1) {
    mpz_clear(local_250._orig._cursor[-1].numeral._den._val);
    mpz_clear((__mpz_struct *)&local_250._orig._cursor[-1].numeral);
  }
  puVar18 = local_268;
  if (local_250._orig._stack !=
      (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0) {
    if (local_250._orig._capacity << 6 == 0) {
      *(undefined8 *)local_250._orig._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_250._orig._stack;
    }
    else if (local_250._orig._capacity << 6 < 0x41) {
      *(undefined8 *)local_250._orig._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_250._orig._stack;
    }
    else {
      operator_delete(local_250._orig._stack,0x10);
      puVar18 = local_268;
    }
  }
  for (; puVar18 != puStack_270; puVar18 = puVar18 + -8) {
    mpz_clear((__mpz_struct *)(puVar18 + -5));
    mpz_clear((__mpz_struct *)(puVar18 + -7));
  }
  if (puStack_270 != (undefined8 *)0x0) {
    if (local_278 << 6 == 0) {
      *puStack_270 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = puStack_270;
    }
    else if ((ulong)(local_278 << 6) < 0x41) {
      *puStack_270 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = puStack_270;
    }
    else {
      operator_delete(puStack_270,0x10);
    }
  }
  if (local_3a0._stack != (Literal **)0x0) {
    uVar13 = local_3a0._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar13 == 0) {
      *local_3a0._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_3a0._stack;
    }
    else if (uVar13 < 0x11) {
      *local_3a0._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_3a0._stack;
    }
    else if (uVar13 < 0x19) {
      *local_3a0._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_3a0._stack;
    }
    else if (uVar13 < 0x21) {
      *local_3a0._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_3a0._stack;
    }
    else if (uVar13 < 0x31) {
      *local_3a0._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_3a0._stack;
    }
    else if (uVar13 < 0x41) {
      *local_3a0._stack = (Literal *)::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_3a0._stack;
    }
    else {
      operator_delete(local_3a0._stack,0x10);
    }
  }
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this_00;
}

Assistant:

ClauseIterator VariableElimination::applyRule(Clause* premise, FoundVariable<NumTraits> found) const
{
  TIME_TRACE("alasca vampire elimination")
  using Numeral = typename NumTraits::ConstantType;
  auto x = found.var;
  DEBUG("eliminating var: ", x)
  auto& I = found.posIneq;
  auto& J = found.negIneq;
  auto& L = found.neq;
  auto& K = found.eq;
  auto Ksize = K.size();

  if (Ksize > 0) {
    env.statistics->alascaVarElimKNonZeroCnt++;
  }
  env.statistics->alascaVarElimKSum += Ksize;
  if (Ksize > env.statistics->alascaVarElimKMax)
    env.statistics->alascaVarElimKMax = Ksize;

  auto Csize = premise->size() - Ksize - I.size() - J.size() - L.size();

  auto withoutX = [x](auto foundVarInLiteral) 
    { return foundVarInLiteral.literal.term().iterSummands()
                              .filter([&](auto monom) { return monom.factors != x; }); };


  Stack<Literal*> common(Csize + I.size() * J.size() + I.size() * L.size() + J.size() * L.size());

  { /* adding C */

    Stack<unsigned> nonCInd;
    auto addNonCInd = [&](auto& x) { for (auto idxd : x) { nonCInd.push(idxd.idx); } };
    addNonCInd(found.eq);
    addNonCInd(found.neq);
    addNonCInd(found.posIneq);
    addNonCInd(found.negIneq);
    std::sort(nonCInd.begin(), nonCInd.end());

    auto iter = nonCInd.iterFifo();
    auto skip = iter.hasNext() ? iter.next() : premise->size();
    for (unsigned i = 0; i < premise->size(); i++) {
      if (skip == i) {
        skip = iter.hasNext() ? iter.next() : premise->size();
      } else {
        ASS(skip > i)
        common.push((*premise)[i]);
      }
    }
  }

  auto b = [x](auto& i) {
    return iterTraits(i.literal.term().iterSummands())
      .filter([&](auto monom) { return monom.factors != x; })
      .map([&](auto t) { return (t / i.numeral.abs()); })
      .map([&](auto t) { return (i.literal.symbol() == AlascaPredicate::EQ || i.literal.symbol() == AlascaPredicate::NEQ) && i.numeral.isNegative()
                                ? -t : t; });
  };

  auto sum = [](auto l, auto r) {
    return NumTraits::sum(
      l.map([](auto monom){ return monom.denormalize(); }),
      r.map([](auto monom){ return monom.denormalize(); })); };

  auto minus = [](auto i) { return i.map([](auto monom) { return Numeral(-1) * monom; }); };

  { 
    // adding { bi + bj >ij 0 | i ∈ I, j ∈ J } 
    for (auto& i : I) {
      for (auto& j : J) {
        auto gr = i.literal.symbol() == AlascaPredicate::GREATER && j.literal.symbol() == AlascaPredicate::GREATER 
          ?  NumTraits::greater
          : NumTraits::geq;
        ASS(i.numeral.isPositive())
        ASS(j.numeral.isNegative())

        common.push(gr(true, sum(b(i), b(j)), NumTraits::zero()));
      }
    }
  }

  {
    // adding {  bi - bl  >i 0 |  i ∈ I,  l ∈ L }
    for (auto& i : I) {
      for (auto& l : L) {
        auto gr = i.literal.symbol() == AlascaPredicate::GREATER ? NumTraits::greater
                                                              : NumTraits::geq;
        common.push(gr(true, sum(b(i), minus(b(l))), NumTraits::zero()));
      }
    }
  }

  {
    // adding {  bj + bl  >j 0 |  j ∈ J,  l ∈ L }
    for (auto& j : J) {
      for (auto& l : L) {
        auto gr = j.literal.symbol() == AlascaPredicate::GREATER ? NumTraits::greater
                                                              : NumTraits::geq;
        common.push(gr(true, sum(b(j), b(l)), NumTraits::zero()));
      }
    }
  }

  { // adding { bl1 - bl2 /= 0 | ordered pairs (l1, l2) of L }
    // TODO write a test for me
    for (auto i1 : iterTraits(getRangeIterator(0u, (unsigned)L.size()))) {
      for (auto i2 : iterTraits(getRangeIterator(i1 + 1, (unsigned)L.size()))) {
        auto& l1 = L[i1];
        auto& l2 = L[i2];
        common.push(NumTraits::eq(false, sum(b(l1), minus(b(l2))), NumTraits::zero()));
      }
    }
  }


  return pvi(iterTraits(partitionIter(std::move(K)))
      .map([common = std::move(common), 
            I = std::move(I), 
            J = std::move(J), 
            L = std::move(L), 
            withoutX, 
            premise, 
            Ksize,
            sum, minus, b](auto& par) {

        auto Kp = [&]() { return par.partition(0);};
        auto Km = [&]() { return par.partition(1); };

        auto Kpsize = par.partitionSize(0);
        auto Kmsize = Ksize - Kpsize;

        Stack<Literal*> concl(common.size() + I.size() * Kpsize + + J.size() * Kmsize);
        concl.loadFromIterator(common.iterFifo());

        // adding {  bi - bk  >= 0 |   i ∈ I,   k ∈ Km }
        for (auto& k : Km()) {
          for (auto& i : I) {
            concl.push(NumTraits::geq(true, sum(b(i), minus(b(k))), NumTraits::zero()));
          }
        }

        // adding {  bj + bk  >= 0 |   j ∈ J,   k ∈ Kp }
        for (auto& k : Kp()) {
          for (auto& j : J) {
            concl.push(NumTraits::geq(true, sum(b(j), b(k)), NumTraits::zero()));
          }
        }

        // adding { bk1 - bk2 >= 0 |  k1 ∈ Kp, k2 ∈ Km }
        for (auto& k1 : Kp()) {
          for (auto& k2 : Km()) {
            // TODO test me
            concl.push(NumTraits::geq(true, sum(b(k1), minus(b(k2))), NumTraits::zero()));
          }
        }

        // adding {  bk - bl  >= 0 |  k ∈ Kp, l ∈ L }
        for (auto& k : Kp()) {
          for (auto& l : L) {
            // TODO test me
            concl.push(NumTraits::geq(true, sum(b(k), minus(b(l))), NumTraits::zero()));
          }
        }

        // adding {  bl - bk  >= 0 |  k ∈ Km, l ∈ L }
        for (auto& k : Km()) {
          for (auto& l : L) {
            // TODO test me
            concl.push(NumTraits::geq(true, sum(b(l), minus(b(k))), NumTraits::zero()));
          }
        }

        Inference inf(GeneratingInference1(Kernel::InferenceRule::ALASCA_VARIABLE_ELIMINATION, premise));
        auto out = Clause::fromStack(concl, inf);
        return out;
      }));
}